

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timedependent.hxx
# Opt level: O0

void __thiscall Time::Time(Time *this,double timestep)

{
  double timestep_local;
  Time *this_local;
  
  Physical::Physical(&this->super_Physical);
  (this->super_Physical)._vptr_Physical = (_func_int **)&PTR__Time_00191710;
  std::vector<TimeDependent_*,_std::allocator<TimeDependent_*>_>::vector(&this->timeObjects);
  std::vector<Estimator_*,_std::allocator<Estimator_*>_>::vector(&this->timeEstimators);
  this->dt = timestep;
  Unit::set(&(this->super_Physical).physicalUnit,0,0,0,1,0,0,0,0);
  std::__cxx11::string::operator=((string *)&(this->super_Physical).physicalDescription,"time");
  return;
}

Assistant:

Time(double timestep) {
		dt = timestep; 
		physicalUnit.set(0, 0,0,1,0,0,0,0); // ms
		physicalDescription = "time";
	}